

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IReaderWriter.h
# Opt level: O2

int __thiscall JetHead::IReaderWriter::writeAll(IReaderWriter *this,void *buffer,int length)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  do {
    if (length <= (int)uVar2) {
      return uVar2;
    }
    iVar1 = (*this->_vptr_IReaderWriter[3])(this,(ulong)uVar2 + (long)buffer);
    uVar2 = uVar2 + iVar1;
  } while (-1 < iVar1);
  return iVar1;
}

Assistant:

virtual int writeAll(const void *buffer, int length)
		{
			int bytesWritten = 0;
			
			while (bytesWritten < length)
			{
				int result = write((uint8_t*)buffer + bytesWritten,
								   length - bytesWritten);
				if (result < 0)
					return result;
	
				bytesWritten += result;
			}
			return bytesWritten;
		}